

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bz2_stream.cpp
# Opt level: O0

void __thiscall minibag::BZ2Stream::startRead(BZ2Stream *this)

{
  FILE *unused;
  FILE *f;
  _func_int **pp_Var1;
  string *msg;
  Stream *in_RDI;
  BZFILE *in_stack_ffffffffffffff88;
  int *in_stack_ffffffffffffff90;
  BagException *this_00;
  int nUnused;
  int in_stack_ffffffffffffffa8;
  int verbosity;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffffc4;
  char *in_stack_ffffffffffffffc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  
  nUnused = (int)((ulong)&in_RDI[2].file_ >> 0x20);
  unused = Stream::getFilePointer(in_RDI);
  verbosity = *(int *)&in_RDI[1]._vptr_Stream;
  f = (FILE *)Stream::getUnused(in_RDI);
  Stream::getUnusedLength(in_RDI);
  pp_Var1 = (_func_int **)
            BZ2_bzReadOpen((int *)in_RDI,f,verbosity,in_stack_ffffffffffffffa8,unused,nUnused);
  in_RDI[2]._vptr_Stream = pp_Var1;
  if (*(int *)&in_RDI[2].file_ == 0) {
    Stream::clearUnused((Stream *)0x18241d);
    return;
  }
  BZ2_bzReadClose(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  uVar2 = CONCAT13(1,(int3)in_stack_ffffffffffffffc0);
  msg = (string *)__cxa_allocate_exception(0x10);
  this_00 = (BagException *)&stack0xffffffffffffffd7;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffffc4,uVar2));
  BagException::BagException(this_00,msg);
  __cxa_throw(msg,&BagException::typeinfo,BagException::~BagException);
}

Assistant:

void BZ2Stream::startRead() {
    bzfile_ = BZ2_bzReadOpen(&bzerror_, getFilePointer(), verbosity_, 0, getUnused(), getUnusedLength());

    switch (bzerror_) {
        case BZ_OK: break;
        default: {
            BZ2_bzReadClose(&bzerror_, bzfile_);
            throw BagException("Error opening file for reading compressed stream");
        }
    }

    clearUnused();
}